

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

FileInfo * __thiscall
anon_unknown.dwarf_28494c::CAPIFileSystem::getLinkInfo
          (FileInfo *__return_storage_ptr__,CAPIFileSystem *this,string *path)

{
  _func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *p_Var1;
  _func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *p_Var2;
  llb_fs_file_info_t file_info;
  llb_fs_file_info_t local_48;
  
  p_Var2 = (this->cAPIDelegate).fs_get_file_info;
  p_Var1 = (this->cAPIDelegate).fs_get_link_info;
  if (p_Var1 == (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)0x0 &&
      p_Var2 == (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)0x0) {
    (*((this->localFileSystem)._M_t.
       super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
       ._M_t.
       super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
       .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl)->_vptr_FileSystem
      [8])(__return_storage_ptr__);
  }
  else {
    if (p_Var1 != (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)0x0) {
      p_Var2 = p_Var1;
    }
    (*p_Var2)((this->cAPIDelegate).context,(path->_M_dataplus)._M_p,&local_48);
    (__return_storage_ptr__->checksum).bytes[0x10] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x11] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x12] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x13] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x14] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x15] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x16] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x17] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x18] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x19] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1a] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1b] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1c] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1d] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1e] = '\0';
    (__return_storage_ptr__->checksum).bytes[0x1f] = '\0';
    (__return_storage_ptr__->checksum).bytes[0] = '\0';
    (__return_storage_ptr__->checksum).bytes[1] = '\0';
    (__return_storage_ptr__->checksum).bytes[2] = '\0';
    (__return_storage_ptr__->checksum).bytes[3] = '\0';
    (__return_storage_ptr__->checksum).bytes[4] = '\0';
    (__return_storage_ptr__->checksum).bytes[5] = '\0';
    (__return_storage_ptr__->checksum).bytes[6] = '\0';
    (__return_storage_ptr__->checksum).bytes[7] = '\0';
    (__return_storage_ptr__->checksum).bytes[8] = '\0';
    (__return_storage_ptr__->checksum).bytes[9] = '\0';
    (__return_storage_ptr__->checksum).bytes[10] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xb] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xc] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xd] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xe] = '\0';
    (__return_storage_ptr__->checksum).bytes[0xf] = '\0';
    __return_storage_ptr__->device = local_48.device;
    __return_storage_ptr__->inode = local_48.inode;
    __return_storage_ptr__->mode = local_48.mode;
    __return_storage_ptr__->size = local_48.size;
    (__return_storage_ptr__->modTime).seconds = local_48.mod_time.seconds;
    (__return_storage_ptr__->modTime).nanoseconds = local_48.mod_time.nanoseconds;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual basic::FileInfo getLinkInfo(const std::string& path) override {
    if (!cAPIDelegate.fs_get_link_info && !cAPIDelegate.fs_get_file_info) {
      return localFileSystem->getLinkInfo(path);
    }

    llb_fs_file_info_t file_info;
    if (cAPIDelegate.fs_get_link_info) {
      cAPIDelegate.fs_get_link_info(cAPIDelegate.context, path.c_str(),
                                    &file_info);
    } else {
      cAPIDelegate.fs_get_file_info(cAPIDelegate.context, path.c_str(),
                                    &file_info);
    }

    basic::FileInfo result{};
    result.device = file_info.device;
    result.inode = file_info.inode;
    result.mode = file_info.mode;
    result.size = file_info.size;
    result.modTime.seconds = file_info.mod_time.seconds;;
    result.modTime.nanoseconds = file_info.mod_time.nanoseconds;
    return result;
  }